

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcCovering::~IfcCovering(IfcCovering *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x8bccc0;
  *(undefined8 *)&this->field_0x180 = 0x8bcdd8;
  *(undefined8 *)&this->field_0x88 = 0x8bcce8;
  *(undefined8 *)&this->field_0x98 = 0x8bcd10;
  *(undefined8 *)&this->field_0xd0 = 0x8bcd38;
  *(undefined8 *)&this->field_0x100 = 0x8bcd60;
  *(undefined8 *)&this->field_0x138 = 0x8bcd88;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8bcdb0;
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x10;
  if (puVar1 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x20) {
    operator_delete(puVar1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__008bcdf8);
  return;
}

Assistant:

IfcCovering() : Object("IfcCovering") {}